

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O0

effect * effect_next(effect *effect)

{
  int iVar1;
  int local_2c;
  int local_28;
  int i;
  int num_subeffects;
  effect *e;
  effect *effect_local;
  
  if ((effect->index == 1) || (effect->index == 0x6a)) {
    iVar1 = dice_evaluate(effect->dice,0,AVERAGE,(random_value *)0x0);
    if (iVar1 < 1) {
      local_2c = 0;
    }
    else {
      local_2c = dice_evaluate(effect->dice,0,AVERAGE,(random_value *)0x0);
    }
    local_28 = 0;
    for (_i = effect; _i != (effect *)0x0 && local_28 < local_2c + 1; _i = _i->next) {
      local_28 = local_28 + 1;
    }
    effect_local = _i;
  }
  else {
    effect_local = effect->next;
  }
  return effect_local;
}

Assistant:

struct effect *effect_next(struct effect *effect)
{
	if (effect->index == EF_RANDOM || effect->index == EF_SELECT) {
		struct effect *e = effect;
		int num_subeffects = MAX(0,
			dice_evaluate(effect->dice, 0, AVERAGE, NULL));
		// Skip all the sub-effects, plus one to advance beyond current
		for (int i = 0; e != NULL && i < num_subeffects + 1; i++) {
			e = e->next;
		}
		return e;
	} else {
		return effect->next;
	}
}